

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::connectedComponents(Graph<Node> *this)

{
  vector<int> *pvVar1;
  int *piVar2;
  long lVar3;
  vector<int> *pvVar4;
  long lVar5;
  vector<bool> used;
  vector<int> currComp;
  int local_4c;
  vector<bool> local_48;
  vector<int> local_38;
  
  vector<bool>::vector(&local_48,this->_nodeCnt);
  vector<int>::vector(&local_38);
  local_4c = 0;
  while( true ) {
    if (this->_nodeCnt <= local_4c) break;
    if (local_48.vect[local_4c] == false) {
      vector<int>::clear(&local_38);
      currCC(this,&local_38,&local_48,&local_4c);
      vector<vector<int>_>::push_back(&this->compList,&local_38);
    }
    local_4c = local_4c + 1;
  }
  vector<int>::resize(&this->inCC,this->_nodeCnt);
  pvVar1 = (this->compList).vect;
  for (lVar3 = 0; lVar3 < (this->compList)._size; lVar3 = lVar3 + 1) {
    pvVar4 = pvVar1 + lVar3;
    piVar2 = (this->inCC).vect;
    for (lVar5 = 0; lVar5 < pvVar4->_size; lVar5 = lVar5 + 1) {
      piVar2[pvVar4->vect[lVar5]] = (int)lVar3;
    }
  }
  vector<int>::~vector(&local_38);
  vector<bool>::~vector(&local_48);
  return;
}

Assistant:

void connectedComponents() {
        vector <bool> used(_nodeCnt);
        vector <int> currComp;

        for (int i = 0; i < _nodeCnt; ++i) {
            if (!used[i]) {
                currComp.clear();
                currCC(currComp, used, i);
                compList.push_back(currComp);
            }
        }

        inCC.resize(_nodeCnt);
        for (int i = 0; i < compList.size(); ++i) {
            for (int j = 0; j < compList[i].size(); ++j) {
                int currNode = compList[i][j];
                inCC[currNode] = i;
            }
        }
    }